

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdBitSelect(Thread *this)

{
  ulong uVar1;
  u8 i;
  long lVar2;
  S result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> rhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> c;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  local_28.v128_.v = (v128)Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    uVar1 = *(ulong *)((long)&local_28 + lVar2 * 8);
    *(ulong *)((long)&local_48 + lVar2 * 8) =
         (*(ulong *)((long)&local_38 + lVar2 * 8) ^ uVar1) & *(ulong *)((long)&local_18 + lVar2 * 8)
         ^ uVar1;
  }
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitSelect() {
  using S = u64x2;
  auto c = Pop<S>();
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = (lhs[i] & c[i]) | (rhs[i] & ~c[i]);
  }
  Push(result);
  return RunResult::Ok;
}